

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyfiledialogs.c
# Opt level: O0

int * getMajorMinorPatch(char *aExecutable)

{
  char *pcVar1;
  char *lTmp;
  char *aExecutable_local;
  
  pcVar1 = getVersion(aExecutable);
  pcVar1 = strtok(pcVar1," ,.-");
  getMajorMinorPatch::lArray[0] = atoi(pcVar1);
  pcVar1 = strtok((char *)0x0," ,.-");
  getMajorMinorPatch::lArray[1] = atoi(pcVar1);
  pcVar1 = strtok((char *)0x0," ,.-");
  getMajorMinorPatch::lArray[2] = atoi(pcVar1);
  if (((getMajorMinorPatch::lArray[0] == 0) && (getMajorMinorPatch::lArray[1] == 0)) &&
     (getMajorMinorPatch::lArray[2] == 0)) {
    aExecutable_local = (char *)0x0;
  }
  else {
    aExecutable_local = (char *)getMajorMinorPatch::lArray;
  }
  return (int *)aExecutable_local;
}

Assistant:

static int * const getMajorMinorPatch( char const * const aExecutable )
{
	static int lArray [3] ;
	char * lTmp ;

	lTmp = (char *) getVersion(aExecutable);
	lArray[0] = atoi( strtok(lTmp," ,.-") ) ;
	/* printf("lArray0 %d\n", lArray[0]); */
	lArray[1] = atoi( strtok(0," ,.-") ) ;
	/* printf("lArray1 %d\n", lArray[1]); */
	lArray[2] = atoi( strtok(0," ,.-") ) ;
	/* printf("lArray2 %d\n", lArray[2]); */

	if ( !lArray[0] && !lArray[1] && !lArray[2] ) return NULL;
	return lArray ;
}